

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscriber.cpp
# Opt level: O1

void __thiscall Subscriber::~Subscriber(Subscriber *this)

{
  ~Subscriber(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Subscriber::~Subscriber() {
  if (this->fd >= 0) {
    close(this->fd);
  }
}